

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.c
# Opt level: O3

int do_op(void)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  char *stptr;
  
  lVar5 = (long)op_idx;
  op_idx = op_idx + -1;
  uVar1 = op_stack[lVar5];
  lVar5 = (long)val_idx;
  uVar2 = 0x1f9f7f;
  if ((0x1f9f7fUL >> ((ulong)uVar1 & 0x3f) & 1) != 0) {
    val_idx = val_idx + -1;
    uVar2 = *(uint *)(&DAT_0011c9bc + lVar5 * 4);
  }
  if (uVar1 - 2 < 0x1b) {
    uVar3 = val_stack[lVar5];
    switch(uVar1) {
    case 2:
      uVar3 = uVar2 + uVar3;
      break;
    case 3:
      uVar3 = uVar2 - uVar3;
      break;
    case 4:
      uVar3 = uVar2 * uVar3;
      break;
    case 5:
      if (uVar3 == 0) {
LAB_0010c2a4:
        stptr = "Divide by zero!";
        goto LAB_0010c2ab;
      }
      uVar3 = (int)uVar2 / (int)uVar3;
      break;
    case 6:
      if (uVar3 == 0) goto LAB_0010c2a4;
      uVar3 = (int)uVar2 % (int)uVar3;
      break;
    case 7:
      uVar3 = -uVar3;
      break;
    case 8:
      uVar3 = uVar2 << ((byte)uVar3 & 0x1f);
      break;
    case 9:
      uVar3 = (int)uVar2 >> ((byte)uVar3 & 0x1f);
      break;
    case 10:
      uVar3 = uVar2 | uVar3;
      break;
    case 0xb:
      uVar3 = uVar2 ^ uVar3;
      break;
    case 0xc:
      uVar3 = uVar2 & uVar3;
      break;
    case 0xd:
      uVar3 = ~uVar3;
      break;
    case 0xe:
      uVar3 = (uint)(uVar3 == 0);
      break;
    case 0xf:
      uVar3 = (uint)(uVar2 == uVar3);
      break;
    case 0x10:
      uVar3 = (uint)(uVar2 != uVar3);
      break;
    case 0x11:
      uVar3 = (uint)((int)uVar2 < (int)uVar3);
      break;
    case 0x12:
      uVar3 = (uint)((int)uVar2 <= (int)uVar3);
      break;
    case 0x13:
      uVar3 = (uint)((int)uVar3 < (int)uVar2);
      break;
    case 0x14:
      uVar3 = (uint)((int)uVar3 <= (int)uVar2);
      break;
    case 0x15:
      iVar4 = check_func_args("DEFINED");
      if (iVar4 == 0) goto LAB_0010c2b0;
      uVar3 = 1;
      if (expr_lablptr->type - 1U < 2) {
        undef = undef + -1;
LAB_0010c25d:
        uVar3 = 0;
      }
      break;
    case 0x16:
      uVar3 = uVar3 >> 8 & 0xff;
      break;
    case 0x17:
      uVar3 = uVar3 & 0xff;
      break;
    case 0x18:
      iVar4 = check_func_args("PAGE");
      if (iVar4 == 0) goto LAB_0010c2b0;
      uVar3 = expr_lablptr->page;
      break;
    case 0x19:
      iVar4 = check_func_args("BANK");
      if (iVar4 == 0) goto LAB_0010c2b0;
      uVar3 = expr_lablptr->bank;
      if (uVar3 == 0xf0 && pass == 1) {
        error("No BANK index for this symbol!");
        goto LAB_0010c25d;
      }
      break;
    case 0x1a:
      iVar4 = check_func_args("VRAM");
      if (iVar4 == 0) goto LAB_0010c2b0;
      if ((pass == 1) && (expr_lablptr->vram == -1)) {
        error("No VRAM address for this symbol!");
      }
      uVar3 = expr_lablptr->vram;
      break;
    case 0x1b:
      iVar4 = check_func_args("PAL");
      if (iVar4 == 0) goto LAB_0010c2b0;
      if ((pass == 1) && (expr_lablptr->pal == -1)) {
        error("No palette index for this symbol!");
      }
      uVar3 = expr_lablptr->pal;
      break;
    case 0x1c:
      iVar4 = check_func_args("SIZEOF");
      if (iVar4 == 0) {
        return 0;
      }
      if ((pass == 1) && (expr_lablptr->data_type == -1)) {
        error("No size attributes for this symbol!");
        return 0;
      }
      uVar3 = expr_lablptr->data_size;
    }
    val_stack[val_idx] = uVar3;
    iVar4 = 1;
  }
  else {
    stptr = "Invalid operator in expression!";
LAB_0010c2ab:
    error(stptr);
LAB_0010c2b0:
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int
do_op(void)
{
	int val[2];
	int op;

	/* operator */
	op = op_stack[op_idx--];

	/* first arg */
	val[0] = val_stack[val_idx];

	/* second arg */
	if (op_pri[op] < 9)
		val[1] = val_stack[--val_idx];

	switch (op) {
	/* BANK */
	case OP_BANK:
		if (!check_func_args("BANK"))
			return (0);
		if (pass == LAST_PASS) {
			if (expr_lablptr->bank == RESERVED_BANK) {
				error("No BANK index for this symbol!");
				val[0] = 0;
				break;
			}
		}
		val[0] = expr_lablptr->bank;
		break;

	/* PAGE */
	case OP_PAGE:
		if (!check_func_args("PAGE"))
			return (0);
		val[0] = expr_lablptr->page;
		break;

	/* VRAM */
	case OP_VRAM:
		if (!check_func_args("VRAM"))
			return (0);
		if (pass == LAST_PASS) {
			if (expr_lablptr->vram == -1)
				error("No VRAM address for this symbol!");
		}
		val[0] = expr_lablptr->vram;
		break;

	/* PAL */
	case OP_PAL:
		if (!check_func_args("PAL"))
			return (0);
		if (pass == LAST_PASS) {
			if (expr_lablptr->pal == -1)
				error("No palette index for this symbol!");
		}
		val[0] = expr_lablptr->pal;
		break;

	/* DEFINED */
	case OP_DEFINED:
		if (!check_func_args("DEFINED"))
			return (0);
		if ((expr_lablptr->type != IFUNDEF) && (expr_lablptr->type != UNDEF))
			val[0] = 1;
		else {
			val[0] = 0;
			undef--;
		}
		break;

	/* SIZEOF */
	case OP_SIZEOF:
		if (!check_func_args("SIZEOF"))
			return (0);
		if (pass == LAST_PASS) {
			if (expr_lablptr->data_type == -1) {
				error("No size attributes for this symbol!");
				return (0);
			}
		}
		val[0] = expr_lablptr->data_size;
		break;

	/* HIGH */
	case OP_HIGH:
		val[0] = (val[0] & 0xFF00) >> 8;
		break;

	/* LOW */
	case OP_LOW:
		val[0] = val[0] & 0xFF;
		break;

	case OP_ADD:
		val[0] = val[1] + val[0];
        break;

	case OP_SUB:
		val[0] = val[1] - val[0];
		break;

	case OP_MUL:
		val[0] = val[1] * val[0];
        break;

    case OP_DIV:
        if (val[0] == 0) {
			error("Divide by zero!");
			return (0);
		}
        val[0] = val[1] / val[0];
        break;

	case OP_MOD:
        if (val[0] == 0) {
			error("Divide by zero!");
			return (0);
		}
        val[0] = val[1] % val[0];
        break;

    case OP_NEG:
		val[0] = -val[0];
        break;

    case OP_SHL:
        val[0] = val[1] << (val[0] & 0x1F);
        break;

    case OP_SHR:
        val[0] = val[1] >> (val[0] & 0x1f);
        break;

	case OP_OR:
        val[0] = val[1] | val[0];
		break;

    case OP_XOR:
        val[0] = val[1] ^ val[0];
		break;

    case OP_AND:
        val[0] = val[1] & val[0];
        break;

    case OP_COM:
        val[0] = ~val[0];
        break;

    case OP_NOT:
        val[0] = !val[0];
        break;

    case OP_EQUAL:
        val[0] = (val[1] == val[0]);
        break;

    case OP_NOT_EQUAL:
        val[0] = (val[1] != val[0]);
        break;

    case OP_LOWER:
        val[0] = (val[1] < val[0]);
        break;

    case OP_LOWER_EQUAL:
        val[0] = (val[1] <= val[0]);
        break;

    case OP_HIGHER:
        val[0] = (val[1] > val[0]);
        break;

    case OP_HIGHER_EQUAL:
        val[0] = (val[1] >= val[0]);
        break;

    default:
		error("Invalid operator in expression!");
		return (0);
    }

	/* result */
    val_stack[val_idx] = val[0];
    return (1);
}